

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

TrackDescriptor * __thiscall
perfetto::CounterTrack::Serialize(TrackDescriptor *__return_storage_ptr__,CounterTrack *this)

{
  byte *pbVar1;
  ulong uVar2;
  uint64_t uVar3;
  _Head_base<0UL,_perfetto::protos::gen::CounterDescriptor_*,_false> _Var4;
  char *__s;
  size_t sVar5;
  TrackDescriptor *desc;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  protos::gen::TrackDescriptor::TrackDescriptor(__return_storage_ptr__);
  __return_storage_ptr__->uuid_ = (this->super_Track).uuid;
  uVar2 = (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar2 | 2;
  uVar3 = (this->super_Track).parent_uuid;
  if (uVar3 != 0) {
    __return_storage_ptr__->parent_uuid_ = uVar3;
    (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar2 | 0x22;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)local_70,this->name_,&local_71);
  ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name_);
  *(byte *)&(__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w =
       (byte)(__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w | 4;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pbVar1 = (byte *)((long)&(__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w + 1);
  *pbVar1 = *pbVar1 | 1;
  _Var4._M_head_impl =
       (__return_storage_ptr__->counter_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::CounterDescriptor,_std::default_delete<perfetto::protos::gen::CounterDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::CounterDescriptor_*,_std::default_delete<perfetto::protos::gen::CounterDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::CounterDescriptor_*,_false>._M_head_impl;
  __s = this->category_;
  if (__s != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar5 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(_Var4._M_head_impl)->categories_,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->unit_ != CounterDescriptor_Unit_UNIT_UNSPECIFIED) {
    (_Var4._M_head_impl)->unit_ = this->unit_;
    *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 8;
  }
  if (this->type_ == CounterDescriptor_BuiltinCounterType_COUNTER_UNSPECIFIED) {
    if (this->unit_name_ != (char *)0x0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,this->unit_name_,&local_71);
      ::std::__cxx11::string::_M_assign((string *)&(_Var4._M_head_impl)->unit_name_);
      *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
           *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 0x40;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
  }
  else {
    (_Var4._M_head_impl)->type_ = this->type_;
    *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 2;
  }
  if (this->unit_multiplier_ != 1) {
    (_Var4._M_head_impl)->unit_multiplier_ = this->unit_multiplier_;
    *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 0x10;
  }
  if (this->is_incremental_ == true) {
    (_Var4._M_head_impl)->is_incremental_ = true;
    *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

protos::gen::TrackDescriptor CounterTrack::Serialize() const {
  auto desc = Track::Serialize();
  desc.set_name(name_);
  auto* counter = desc.mutable_counter();
  if (category_)
    counter->add_categories(category_);
  if (unit_ != perfetto::protos::pbzero::CounterDescriptor::UNIT_UNSPECIFIED)
    counter->set_unit(static_cast<protos::gen::CounterDescriptor_Unit>(unit_));
  {
    // if |type| is set, we don't want to emit |unit_name|. Trace processor
    // infers the track name from the type in that case.
    if (type_ !=
        perfetto::protos::gen::CounterDescriptor::COUNTER_UNSPECIFIED) {
      counter->set_type(type_);
    } else if (unit_name_) {
      counter->set_unit_name(unit_name_);
    }
  }
  if (unit_multiplier_ != 1)
    counter->set_unit_multiplier(unit_multiplier_);
  if (is_incremental_)
    counter->set_is_incremental(is_incremental_);
  return desc;
}